

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O1

void __thiscall libtorrent::anon_unknown_6::ut_pex_plugin::tick(ut_pex_plugin *this)

{
  _Rb_tree_header *p_Var1;
  ushort uVar2;
  torrent *ptVar3;
  pointer pppVar4;
  peer_connection *this_00;
  pointer pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  torrent_flags_t tVar9;
  time_point tVar10;
  entry *peVar11;
  string_type *psVar12;
  string_type *psVar13;
  undefined4 extraout_var;
  iterator __position;
  undefined4 extraout_var_00;
  _Base_ptr p_Var15;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *out;
  char cVar16;
  pointer pppVar17;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  endpoint remote;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pld6_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pla6_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pld_out;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pla_out;
  entry pex;
  set<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  dropped;
  data_union local_e8;
  string_type *local_c8;
  string_type *local_c0;
  _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
  *local_b8;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  variant<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  local_90;
  _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
  local_68;
  bencode_visitor<std::back_insert_iterator<std::vector<char,_std::allocator<char>_>_>_> local_38;
  undefined8 *puVar14;
  
  tVar9 = aux::torrent::flags(this->m_torrent);
  if (((uint)tVar9.m_val >> 0x15 & 1) == 0) {
    tVar10 = aux::time_now();
    if ((this->m_last_msg).__d.__r <= (long)tVar10.__d.__r + -60000000000) {
      (this->m_last_msg).__d.__r = (rep)tVar10.__d.__r;
      ptVar3 = this->m_torrent;
      if ((int)((ulong)((long)(ptVar3->super_torrent_hot_members).m_connections.
                              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              .
                              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(ptVar3->super_torrent_hot_members).m_connections.
                             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                             .
                             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) !=
          (int)((ulong)((long)(ptVar3->m_peers_to_disconnect).
                              super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(ptVar3->m_peers_to_disconnect).
                             super__Vector_base<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4)) {
        entry::entry((entry *)&local_90);
        key._M_str = "added";
        key._M_len = 5;
        peVar11 = entry::operator[]((entry *)&local_90,key);
        psVar12 = entry::string_abi_cxx11_(peVar11);
        key_00._M_str = "dropped";
        key_00._M_len = 7;
        peVar11 = entry::operator[]((entry *)&local_90,key_00);
        psVar13 = entry::string_abi_cxx11_(peVar11);
        key_01._M_str = "added.f";
        key_01._M_len = 7;
        peVar11 = entry::operator[]((entry *)&local_90,key_01);
        local_c0 = entry::string_abi_cxx11_(peVar11);
        key_02._M_str = "added6";
        key_02._M_len = 6;
        local_a0.container = psVar13;
        local_98.container = psVar12;
        peVar11 = entry::operator[]((entry *)&local_90,key_02);
        psVar12 = entry::string_abi_cxx11_(peVar11);
        key_03._M_str = "dropped6";
        key_03._M_len = 8;
        peVar11 = entry::operator[]((entry *)&local_90,key_03);
        psVar13 = entry::string_abi_cxx11_(peVar11);
        key_04._M_str = "added6.f";
        key_04._M_len = 8;
        peVar11 = entry::operator[]((entry *)&local_90,key_04);
        local_c8 = entry::string_abi_cxx11_(peVar11);
        p_Var1 = &local_68._M_impl.super__Rb_tree_header;
        local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_b8 = (_Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                    *)&this->m_old_peers;
        local_b0.container = psVar13;
        local_a8.container = psVar12;
        local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        ::std::
        _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ::swap((_Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                *)local_b8,&local_68);
        iVar8 = 0;
        this->m_peers_in_message = 0;
        pppVar4 = (this->m_torrent->super_torrent_hot_members).m_connections.
                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  .
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pppVar17 = (this->m_torrent->super_torrent_hot_members).m_connections.
                        super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        .
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; pppVar17 != pppVar4;
            pppVar17 = pppVar17 + 1) {
          this_00 = *pppVar17;
          iVar7 = 3;
          if (((this_00->field_0x885 & 0x18) != 0) &&
             (((this_00->super_peer_connection_hot_members).field_0x28 & 2) == 0)) {
            iVar6 = (*(this_00->super_bandwidth_socket)._vptr_bandwidth_socket[0x1b])(this_00);
            if ((char)iVar6 == '\0') {
              iVar7 = (*(this_00->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])(this_00);
              puVar14 = (undefined8 *)CONCAT44(extraout_var,iVar7);
              local_e8._0_8_ = *puVar14;
              local_e8._20_8_ = *(undefined8 *)((long)puVar14 + 0x14);
              local_e8._16_4_ = (undefined4)((ulong)*(undefined8 *)((long)puVar14 + 0xc) >> 0x20);
              local_e8._8_4_ = (undefined4)puVar14[1];
              local_e8._12_4_ = (undefined4)((ulong)puVar14[1] >> 0x20);
              ::std::
              _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
              ::_M_insert_unique<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&>
                        (local_b8,(basic_endpoint<boost::asio::ip::tcp> *)&local_e8.base);
              __position = ::std::
                           _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                           ::find(&local_68,(key_type *)&local_e8.base);
              if ((_Rb_tree_header *)__position._M_node == p_Var1) {
                iVar7 = 2;
                if (iVar8 < 100) {
                  iVar6 = (*(this_00->super_bandwidth_socket)._vptr_bandwidth_socket[4])(this_00);
                  iVar7 = 3;
                  if ((char)iVar6 == '\0') {
                    if ((this_00->field_0x885 & 8) == 0) {
                      iVar7 = (*(this_00->super_bandwidth_socket)._vptr_bandwidth_socket[7])
                                        (this_00);
                      if ((CONCAT44(extraout_var_00,iVar7) != 0) &&
                         (uVar2 = *(ushort *)(CONCAT44(extraout_var_00,iVar7) + 0x18), uVar2 != 0))
                      {
                        local_e8.v4.sin_port = uVar2 << 8 | uVar2 >> 8;
                      }
                    }
                    aux::peer_connection::is_seed(this_00);
                    aux::is_utp(&this_00->m_socket);
                    if (local_e8.base.sa_family == 2) {
                      aux::
                      write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                                ((basic_endpoint<boost::asio::ip::tcp> *)&local_e8.base,&local_98);
                      cVar16 = (char)local_c0;
                    }
                    else {
                      aux::
                      write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                                ((basic_endpoint<boost::asio::ip::tcp> *)&local_e8.base,&local_a8);
                      cVar16 = (char)local_c8;
                    }
                    ::std::__cxx11::string::push_back(cVar16);
                    iVar8 = iVar8 + 1;
                    this->m_peers_in_message = this->m_peers_in_message + 1;
                    iVar7 = 0;
                  }
                }
              }
              else {
                iVar7 = 0;
                ::std::
                _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                ::erase_abi_cxx11_((_Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>
                                    *)&local_68,(const_iterator)__position._M_node);
              }
            }
          }
          if ((iVar7 != 3) && (iVar7 != 0)) break;
        }
        if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
          p_Var15 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
          do {
            out = &local_b0;
            if ((short)p_Var15[1]._M_color == 2) {
              out = &local_a0;
            }
            aux::
            write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                      ((basic_endpoint<boost::asio::ip::tcp> *)(p_Var15 + 1),out);
            this->m_peers_in_message = this->m_peers_in_message + 1;
            p_Var15 = (_Base_ptr)::std::_Rb_tree_increment(p_Var15);
          } while ((_Rb_tree_header *)p_Var15 != p_Var1);
        }
        local_e8._0_8_ = &this->m_ut_pex_msg;
        pcVar5 = (this->m_ut_pex_msg).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((this->m_ut_pex_msg).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish != pcVar5) {
          (this->m_ut_pex_msg).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish = pcVar5;
        }
        local_38.out = (back_insert_iterator<std::vector<char,_std::allocator<char>_>_> *)&local_e8;
        ::std::
        visit<libtorrent::aux::bencode_visitor<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>,std::variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>const&>
                  (&local_38,&local_90);
        ::std::
        _Rb_tree<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::_Identity<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::less<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
        ::~_Rb_tree(&local_68);
        entry::~entry((entry *)&local_90);
      }
    }
  }
  return;
}

Assistant:

void tick() override
		{
			if (m_torrent.flags() & torrent_flags::disable_pex) return;

			time_point const now = aux::time_now();
			if (now - seconds(60) < m_last_msg) return;
			m_last_msg = now;

			if (m_torrent.num_peers() == 0) return;

			entry pex;
			std::string& pla = pex["added"].string();
			std::string& pld = pex["dropped"].string();
			std::string& plf = pex["added.f"].string();
			std::back_insert_iterator<std::string> pla_out(pla);
			std::back_insert_iterator<std::string> pld_out(pld);
			std::back_insert_iterator<std::string> plf_out(plf);
			std::string& pla6 = pex["added6"].string();
			std::string& pld6 = pex["dropped6"].string();
			std::string& plf6 = pex["added6.f"].string();
			std::back_insert_iterator<std::string> pla6_out(pla6);
			std::back_insert_iterator<std::string> pld6_out(pld6);
			std::back_insert_iterator<std::string> plf6_out(plf6);

			std::set<tcp::endpoint> dropped;
			m_old_peers.swap(dropped);

			m_peers_in_message = 0;
			int num_added = 0;
			for (auto const* peer : m_torrent)
			{
				if (!send_peer(*peer)) continue;

				tcp::endpoint remote = peer->remote();
				m_old_peers.insert(remote);

				auto const di = dropped.find(remote);
				if (di == dropped.end())
				{
					// don't write too big of a package
					if (num_added >= max_peer_entries) break;

					// only send proper bittorrent peers
					if (peer->type() != connection_type::bittorrent)
						continue;

					auto const* const p = static_cast<aux::bt_peer_connection const*>(peer);

					// if the peer has told us which port its listening on,
					// use that port. But only if we didn't connect to the peer.
					// if we connected to it, use the port we know works
					if (!p->is_outgoing())
					{
						aux::torrent_peer const* const pi = peer->peer_info_struct();
						if (pi != nullptr && pi->port > 0)
							remote.port(pi->port);
					}

					// no supported flags to set yet
					// 0x01 - peer supports encryption
					// 0x02 - peer is a seed
					// 0x04 - supports uTP. This is only a positive flags
					//        passing 0 doesn't mean the peer doesn't
					//        support uTP
					// 0x08 - supports hole punching protocol. If this
					//        flag is received from a peer, it can be
					//        used as a rendezvous point in case direct
					//        connections to the peer fail
					pex_flags_t flags = p->is_seed() ? pex_seed : pex_flags_t{};
#if !defined TORRENT_DISABLE_ENCRYPTION
					flags |= p->supports_encryption() ? pex_encryption : pex_flags_t{};
#endif
					flags |= is_utp(p->get_socket()) ? pex_utp : pex_flags_t{};
					flags |= p->supports_holepunch() ? pex_holepunch : pex_flags_t{};

					// i->first was added since the last time
					if (aux::is_v4(remote))
					{
						aux::write_endpoint(remote, pla_out);
						aux::write_uint8(static_cast<std::uint8_t>(flags), plf_out);
					}
					else
					{
						aux::write_endpoint(remote, pla6_out);
						aux::write_uint8(static_cast<std::uint8_t>(flags), plf6_out);
					}
					++num_added;
					++m_peers_in_message;
				}
				else
				{
					// this was in the previous message
					// so, it wasn't dropped
					dropped.erase(di);
				}
			}

			for (auto const& i : dropped)
			{
				if (aux::is_v4(i))
					aux::write_endpoint(i, pld_out);
				else
					aux::write_endpoint(i, pld6_out);
				++m_peers_in_message;
			}

			m_ut_pex_msg.clear();
			bencode(std::back_inserter(m_ut_pex_msg), pex);
		}